

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O1

int call_binTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  TValue *f;
  bool bVar1;
  
  f = luaT_gettmbyobj(L,p1,event);
  if (f->tt == 0) {
    f = luaT_gettmbyobj(L,p2,event);
  }
  bVar1 = f->tt != 0;
  if (bVar1) {
    callTMres(L,res,f,p1,p2);
  }
  return (uint)bVar1;
}

Assistant:

static int call_binTM (lua_State *L, const TValue *p1, const TValue *p2,
                       StkId res, TMS event) {
  const TValue *tm = luaT_gettmbyobj(L, p1, event);  /* try first operand */
  if (ttisnil(tm))
    tm = luaT_gettmbyobj(L, p2, event);  /* try second operand */
  if (ttisnil(tm)) return 0;
  callTMres(L, res, tm, p1, p2);
  return 1;
}